

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

bool __thiscall
dxil_spv::CFGNode::post_dominates_any_work
          (CFGNode *this,CFGNode *parent,UnorderedSet<const_CFGNode_*> *node_cache)

{
  CFGNode *pCVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  const_iterator cVar4;
  pointer ppCVar5;
  __hashtable *__h;
  bool bVar6;
  bool bVar7;
  __node_gen_type __node_gen;
  CFGNode *local_30;
  UnorderedSet<const_CFGNode_*> *local_28;
  
  local_30 = parent;
  cVar4 = std::
          _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&node_cache->_M_h,&local_30);
  if (cVar4.super__Node_iterator_base<const_dxil_spv::CFGNode_*,_false>._M_cur == (__node_type *)0x0
     ) {
    local_28 = node_cache;
    std::
    _Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<dxil_spv::CFGNode_const*const&,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<dxil_spv::CFGNode_const*,false>>>>
              ((_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)node_cache,&local_30);
    if (((local_30->ir).operations.
         super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (local_30->ir).operations.
         super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((local_30->ir).phi.
        super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (local_30->ir).phi.
        super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      while( true ) {
        bVar6 = local_30 == this;
        if (bVar6) {
          return bVar6;
        }
        pCVar1 = local_30->immediate_post_dominator;
        if (pCVar1 == (CFGNode *)0x0) break;
        bVar7 = local_30 == pCVar1;
        local_30 = pCVar1;
        if (bVar7) {
          return bVar6;
        }
      }
      return bVar6;
    }
    ppCVar2 = (local_30->pred).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppCVar3 = (local_30->pred).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar2 != ppCVar3) {
      do {
        ppCVar5 = ppCVar2 + 1;
        bVar6 = post_dominates_any_work(this,*ppCVar2,node_cache);
        if (bVar6) {
          return bVar6;
        }
        ppCVar2 = ppCVar5;
      } while (ppCVar5 != ppCVar3);
      return bVar6;
    }
  }
  return false;
}

Assistant:

bool CFGNode::post_dominates_any_work(const CFGNode *parent, UnorderedSet<const CFGNode *> &node_cache) const
{
	// If we reached this node before and didn't terminate, it must have returned false.
	if (node_cache.count(parent))
		return false;
	node_cache.insert(parent);

	// This is not a dummy block, we have an answer.
	if (!parent->ir.operations.empty() || !parent->ir.phi.empty())
		return post_dominates(parent);

	for (auto *p : parent->pred)
		if (post_dominates_any_work(p, node_cache))
			return true;

	return false;
}